

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O2

void __thiscall DictionaryStats::DictionaryStats(DictionaryStats *this,char *name,uint bucketCount)

{
  int iVar1;
  DictionaryType *__s;
  DictionaryType **ppDVar2;
  
  this->pNext = (DictionaryStats *)0x0;
  this->initialSize = bucketCount;
  this->finalSize = bucketCount;
  this->countOfEmptyBuckets = bucketCount;
  this->countOfResize = 0;
  this->itemCount = 0;
  this->maxDepth = 0;
  this->lookupCount = 0;
  this->collisionCount = 0;
  this->lookupDepthTotal = 0;
  *(undefined8 *)&this->maxLookupDepth = 0;
  *(undefined4 *)((long)&this->pName + 4) = 0;
  CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
  ppDVar2 = &dictionaryTypes;
  while (__s = *ppDVar2, __s != (DictionaryType *)0x0) {
    iVar1 = strncmp(name,__s->name,0xff);
    if (iVar1 == 0) goto LAB_0060ae11;
    ppDVar2 = &__s->pNext;
  }
  __s = (DictionaryType *)
        Memory::NoCheckHeapAllocator::Alloc
                  ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x118);
  memset(__s,0,0x118);
  __s->pNext = dictionaryTypes;
  dictionaryTypes = __s;
  strncpy_s<256ul>(&__s->name,name,0xff);
  __s->name[0xff] = '\0';
LAB_0060ae11:
  CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
  this->pName = __s->name;
  this->pNext = __s->instances;
  __s->instances = this;
  __s->instancesCount = __s->instancesCount + 1;
  return;
}

Assistant:

DictionaryStats::DictionaryStats(const char* name, uint bucketCount)
    :
    initialSize(bucketCount),
    finalSize(bucketCount),
    countOfEmptyBuckets(bucketCount),
    countOfResize(0),
    itemCount(0),
    maxDepth(0),
    lookupCount(0),
    collisionCount(0),
    lookupDepthTotal(0),
    maxLookupDepth(0),
    pNext(NULL),
    pName(NULL)
{
    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* type = NULL;
    // See if we already created instance(s) of this type
    DictionaryType* current = dictionaryTypes;
    while(current)
    {
        if (strncmp(name, current->name, _countof(current->name)-1) == 0)
        {
            type = current;
            break;
        }
        current = current->pNext;
    }

    if (!type)
    {
        // We haven't seen this type before so add a new entry for it
        type = NoCheckHeapNew(DictionaryType);
        type->pNext = dictionaryTypes;
        dictionaryTypes = type;
        type->instancesCount = 0;
        strncpy_s(type->name, name, _countof(type->name)-1);
        type->name[sizeof(type->name)-1]='\0';
    }
    dictionaryTypesCriticalSection.Leave();
    // keep a pointer to the name in case we are asked to clone ourselves
    pName = type->name;

    // Add ourself in the list
    pNext = type->instances;
    type->instances = this;
    ++(type->instancesCount);
}